

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

TPZSkylMatrix<double> * __thiscall
TPZSkylMatrix<double>::operator+(TPZSkylMatrix<double> *this,TPZSkylMatrix<double> *A)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  TPZSkylMatrix<double> *pTVar3;
  int64_t iVar4;
  double *pdVar5;
  long *in_RDX;
  TPZSkylMatrix<double> *in_RSI;
  TPZSkylMatrix<double> *in_RDI;
  int i;
  int64_t size;
  TPZSkylMatrix<double> *res;
  char *in_stack_00000188;
  char *in_stack_00000190;
  int local_38;
  TPZSkylMatrix<double> *this_00;
  
  iVar2 = (*(in_RSI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  this_00 = (TPZSkylMatrix<double> *)CONCAT44(extraout_var,iVar2);
  pTVar3 = (TPZSkylMatrix<double> *)(**(code **)(*in_RDX + 0x60))();
  if (this_00 != pTVar3) {
    TPZMatrix<double>::Error(in_stack_00000190,in_stack_00000188);
  }
  (*(in_RSI->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x4a])
            (in_RSI,in_RSI,in_RDX);
  TPZSkylMatrix(this_00,in_RSI);
  iVar4 = TPZVec<double>::size(&in_RDI->fStorage);
  for (local_38 = 0; local_38 < iVar4; local_38 = local_38 + 1) {
    pdVar5 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDX + 8),(long)local_38);
    dVar1 = *pdVar5;
    pdVar5 = TPZVec<double>::operator[](&in_RDI->fStorage,(long)local_38);
    *pdVar5 = dVar1 + *pdVar5;
  }
  return in_RDI;
}

Assistant:

TPZSkylMatrix<TVar>
TPZSkylMatrix<TVar>::operator+(const TPZSkylMatrix<TVar> &A) const
{
  
	if ( this->Dim() != A.Dim() )
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"<incompatible dimensions>" );
  CheckTypeCompatibility(this,&A);
	auto res(*this);
  const auto size = res.fStorage.size();
  for(auto i = 0; i < size; i++) res.fStorage[i] += A.fStorage[i];
	return res;
}